

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O0

HighsTask * __thiscall HighsSplitDeque::randomSteal(HighsSplitDeque *this)

{
  HighsTask *pHVar1;
  HighsRandom *in_RDI;
  HighsInt next;
  HighsSplitDeque *in_stack_00000120;
  HighsInt in_stack_fffffffffffffff4;
  
  HighsRandom::integer(in_RDI,in_stack_fffffffffffffff4);
  std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>::operator->
            ((unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_> *)
             0x4c005b);
  pHVar1 = steal(in_stack_00000120);
  return pHVar1;
}

Assistant:

HighsTask* randomSteal() {
    HighsInt next = ownerData.randgen.integer(ownerData.numWorkers - 1);
    next += next >= ownerData.ownerId;
    assert(next != ownerData.ownerId);
    assert(next >= 0);
    assert(next < ownerData.numWorkers);

    return ownerData.workers[next]->steal();
  }